

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O1

void Psr_ManCleanMap(Psr_Ntk_t *pNtk,Vec_Int_t *vMap)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  if (0 < (pNtk->vInputs).nSize) {
    lVar5 = 0;
    do {
      if ((pNtk->vInputs).nSize <= lVar5) goto LAB_003b72d6;
      uVar7 = (pNtk->vInputs).pArray[lVar5];
      if ((ulong)uVar7 == 0) break;
      if (((int)uVar7 < 0) || (vMap->nSize <= (int)uVar7)) goto LAB_003b7279;
      vMap->pArray[uVar7] = -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vInputs).nSize);
  }
  if (0 < (pNtk->vObjs).nSize) {
    piVar3 = (pNtk->vObjs).pArray;
    lVar5 = 0;
    do {
      iVar1 = piVar3[lVar5];
      if (((long)iVar1 < 0) || (iVar2 = (pNtk->vBoxes).nSize, iVar2 <= iVar1)) goto LAB_003b72d6;
      piVar4 = (pNtk->vBoxes).pArray;
      Psr_BoxSignals_V._0_4_ = piVar4[iVar1] + -2;
      iVar1 = piVar3[lVar5];
      Psr_BoxSignals_V._4_4_ = Psr_BoxSignals_V._0_4_;
      if ((iVar1 < -3) || (uVar7 = iVar1 + 3, iVar2 <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      piVar4 = piVar4 + uVar7;
      Psr_BoxSignals_V._8_8_ = piVar4;
      if (1 < (int)Psr_BoxSignals_V._0_4_) {
        lVar6 = 1;
        do {
          uVar7 = piVar4[lVar6];
          if ((pNtk->field_0x4 & 2) != 0) {
            if ((int)uVar7 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x13e,"int Abc_Lit2Att2(int)");
            }
            if ((uVar7 & 3) != 0) {
              __assert_fail("Abc_Lit2Att2(i) == BAC_PRS_NAME",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrs.h"
                            ,0x77,"int Psr_NtkSigName(Psr_Ntk_t *, int)");
            }
            uVar7 = uVar7 >> 2;
          }
          if (((int)uVar7 < 0) || (vMap->nSize <= (int)uVar7)) goto LAB_003b7279;
          vMap->pArray[uVar7] = -1;
          lVar6 = lVar6 + 2;
        } while ((int)lVar6 < (int)Psr_BoxSignals_V._4_4_);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vObjs).nSize);
  }
  if (0 < (pNtk->vOutputs).nSize) {
    lVar5 = 0;
    do {
      if ((pNtk->vOutputs).nSize <= lVar5) {
LAB_003b72d6:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = (pNtk->vOutputs).pArray[lVar5];
      if ((ulong)uVar7 == 0) {
        return;
      }
      if (((int)uVar7 < 0) || (vMap->nSize <= (int)uVar7)) {
LAB_003b7279:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      vMap->pArray[uVar7] = -1;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNtk->vOutputs).nSize);
  }
  return;
}

Assistant:

void Psr_ManCleanMap( Psr_Ntk_t * pNtk, Vec_Int_t * vMap )
{
    Vec_Int_t * vSigs; 
    int i, k, NameId, Sig;
    Psr_NtkForEachPi( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
    Psr_NtkForEachBox( pNtk, vSigs, i )
        Vec_IntForEachEntryDouble( vSigs, NameId, Sig, k )
            Vec_IntWriteEntry( vMap, Psr_NtkSigName(pNtk, Sig), -1 );
    Psr_NtkForEachPo( pNtk, NameId, i )
        Vec_IntWriteEntry( vMap, NameId, -1 );
}